

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O2

value_type * __thiscall
pstore::index::
hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
::load_leaf_node(value_type *__return_storage_ptr__,
                hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                *this,database *db,address addr)

{
  database *local_48;
  value_type local_40;
  pair<pstore::uint128,_pstore::extent<pstore::repo::fragment>_> local_38;
  
  local_48 = db;
  local_40 = addr.a_;
  serialize::
  read<std::pair<pstore::uint128,pstore::extent<pstore::repo::fragment>>,pstore::serialize::archive::database_reader>
            (&local_38,(serialize *)&local_48,(database_reader *)db);
  *(undefined8 *)&(__return_storage_ptr__->first).v_ = (undefined8)local_38.first.v_;
  *(undefined8 *)((long)&(__return_storage_ptr__->first).v_ + 8) = local_38.first.v_._8_8_;
  (__return_storage_ptr__->second).addr.a_.a_ = (value_type)local_38.second.addr.a_.a_;
  (__return_storage_ptr__->second).size = local_38.second.size;
  return __return_storage_ptr__;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::load_leaf_node (database const & db,
                                                                           address const addr) const
            -> value_type {

            return serialize::read<std::pair<KeyType, ValueType>> (
                serialize::archive::database_reader{db, addr});
        }